

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * __thiscall cfd::core::HashUtil::Output(ByteData *__return_storage_ptr__,HashUtil *this)

{
  undefined8 uVar1;
  string *in_stack_fffffffffffffe90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  undefined8 in_stack_fffffffffffffe98;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffea0;
  allocator local_121;
  string local_120 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ByteData256 local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ByteData256 local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData160 local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  ByteData160 local_30;
  HashUtil *local_18;
  HashUtil *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_18 = this;
  this_local = (HashUtil *)__return_storage_ptr__;
  switch(this->hash_type_) {
  case '\x01':
    ByteData::GetBytes(&local_48,&this->buffer_);
    Ripemd160(&local_30,&local_48);
    ByteData160::GetData(__return_storage_ptr__,&local_30);
    ByteData160::~ByteData160((ByteData160 *)0x3ed236);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90);
    break;
  case '\x02':
    ByteData::GetBytes(&local_88,&this->buffer_);
    Hash160(&local_70,&local_88);
    ByteData160::GetData(__return_storage_ptr__,&local_70);
    ByteData160::~ByteData160((ByteData160 *)0x3ed2bd);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90);
    break;
  case '\x03':
    pvVar2 = &local_b8;
    ByteData::GetBytes(pvVar2,&this->buffer_);
    Sha256(&local_a0,pvVar2);
    ByteData256::GetData(__return_storage_ptr__,&local_a0);
    ByteData256::~ByteData256((ByteData256 *)0x3ed350);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90);
    break;
  case '\x04':
    pvVar2 = &local_e8;
    ByteData::GetBytes(pvVar2,&this->buffer_);
    Sha256D(&local_d0,pvVar2);
    ByteData256::GetData(__return_storage_ptr__,&local_d0);
    ByteData256::~ByteData256((ByteData256 *)0x3ed3ec);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe90);
    break;
  case '\x05':
    pvVar2 = &local_100;
    ByteData::GetBytes(pvVar2,&this->buffer_);
    Sha512(__return_storage_ptr__,pvVar2);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar2);
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_120,"unknown hash type.",&local_121);
    CfdException::CfdException(in_stack_fffffffffffffea0,error_code,in_stack_fffffffffffffe90);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Output() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes()).GetData();
    case kHash160:
      return Hash160(buffer_.GetBytes()).GetData();
    case kSha256:
      return Sha256(buffer_.GetBytes()).GetData();
    case kSha256D:
      return Sha256D(buffer_.GetBytes()).GetData();
    case kSha512:
      return Sha512(buffer_.GetBytes());
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}